

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

string * __thiscall
phosg::Image::png_data_url_abi_cxx11_(string *__return_storage_ptr__,Image *this)

{
  string *__return_storage_ptr___00;
  undefined1 local_58 [8];
  string base64_data;
  string png_data;
  Image *this_local;
  
  __return_storage_ptr___00 = (string *)((long)&base64_data.field_2 + 8);
  save_abi_cxx11_(__return_storage_ptr___00,this,PNG);
  base64_encode((string *)local_58,__return_storage_ptr___00,(char *)0x0);
  ::std::operator+(__return_storage_ptr__,"data:image/png;base64,",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  ::std::__cxx11::string::~string((string *)local_58);
  ::std::__cxx11::string::~string((string *)(base64_data.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

string Image::png_data_url() const {
  string png_data = this->save(Format::PNG);
  string base64_data = base64_encode(png_data);
  return "data:image/png;base64," + base64_data;
}